

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

void wabt::anon_unknown_1::ResolveTypeNames(Module *module,FuncDeclaration *decl)

{
  long lVar1;
  pointer pTVar2;
  ulong uVar3;
  
  if (decl != (FuncDeclaration *)0x0) {
    pTVar2 = (decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (((long)(decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
               _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 & 0x7fffffff8U) != 0) {
      lVar1 = 0;
      uVar3 = 0;
      do {
        ResolveTypeName(module,(Type *)((long)&pTVar2->enum_ + lVar1),(Index)uVar3,
                        &(decl->sig).param_type_names);
        uVar3 = uVar3 + 1;
        pTVar2 = (decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar1 = lVar1 + 8;
      } while (uVar3 < ((ulong)((long)(decl->sig).param_types.
                                      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2) >> 3
                       & 0xffffffff));
    }
    pTVar2 = (decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (((long)(decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
               _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 & 0x7fffffff8U) != 0) {
      lVar1 = 0;
      uVar3 = 0;
      do {
        ResolveTypeName(module,(Type *)((long)&pTVar2->enum_ + lVar1),(Index)uVar3,
                        &(decl->sig).result_type_names);
        uVar3 = uVar3 + 1;
        pTVar2 = (decl->sig).result_types.
                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar1 = lVar1 + 8;
      } while (uVar3 < ((ulong)((long)(decl->sig).result_types.
                                      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2) >> 3
                       & 0xffffffff));
    }
    return;
  }
  __assert_fail("decl",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                ,0x14b,
                "void wabt::(anonymous namespace)::ResolveTypeNames(const Module &, FuncDeclaration *)"
               );
}

Assistant:

void ResolveTypeNames(const Module& module, FuncDeclaration* decl) {
  assert(decl);
  auto& signature = decl->sig;

  for (uint32_t param_index = 0; param_index < signature.GetNumParams();
       ++param_index) {
    ResolveTypeName(module, signature.param_types[param_index], param_index,
                    signature.param_type_names);
  }

  for (uint32_t result_index = 0; result_index < signature.GetNumResults();
       ++result_index) {
    ResolveTypeName(module, signature.result_types[result_index], result_index,
                    signature.result_type_names);
  }
}